

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void xmlMemFree(void *ptr)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  int *__ptr;
  char *target;
  MEMHDR *p;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    if (ptr == (void *)0xffffffffffffffff) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"trying to free pointer from freed area\n");
    }
    else {
      if (xmlMemTraceBlockAt == ptr) {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"%p : Freed()\n",xmlMemTraceBlockAt);
        xmlMallocBreakpoint();
      }
      __ptr = (int *)((long)ptr + -0x28);
      if (*__ptr == 0x5aa5) {
        if ((ulong)xmlMemStopAtBlock == *(ulong *)((long)ptr + -0x20)) {
          xmlMallocBreakpoint();
        }
        *__ptr = -0x5aa6;
        memset(ptr,0xff,*(size_t *)((long)ptr + -0x18));
        xmlMutexLock(xmlMemMutex);
        debugMemSize = debugMemSize - *(long *)((long)ptr + -0x18);
        debugMemBlocks = debugMemBlocks - 1;
        xmlMutexUnlock(xmlMemMutex);
        free(__ptr);
        return;
      }
      debugmem_tag_error(__ptr);
    }
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"xmlMemFree(%p) error\n",ptr);
    xmlMallocBreakpoint();
  }
  return;
}

Assistant:

void
xmlMemFree(void *ptr)
{
    MEMHDR *p;
    char *target;
#ifdef DEBUG_MEMORY
    size_t size;
#endif

    if (ptr == NULL)
	return;

    if (ptr == (void *) -1) {
	xmlGenericError(xmlGenericErrorContext,
	    "trying to free pointer from freed area\n");
        goto error;
    }

    if (xmlMemTraceBlockAt == ptr) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Freed()\n", xmlMemTraceBlockAt);
	xmlMallocBreakpoint();
    }

    TEST_POINT

    target = (char *) ptr;

    p = CLIENT_2_HDR(ptr);
    if (p->mh_tag != MEMTAG) {
        Mem_Tag_Err(p);
        goto error;
    }
    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();
    p->mh_tag = ~MEMTAG;
    memset(target, -1, p->mh_size);
    xmlMutexLock(xmlMemMutex);
    debugMemSize -= p->mh_size;
    debugMemBlocks--;
#ifdef DEBUG_MEMORY
    size = p->mh_size;
#endif
#ifdef MEM_LIST
    debugmem_list_delete(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    free(p);

    TEST_POINT

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Freed(%d) Ok\n", size);
#endif

    return;

error:
    xmlGenericError(xmlGenericErrorContext,
	    "xmlMemFree(%p) error\n", ptr);
    xmlMallocBreakpoint();
    return;
}